

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLiSample> * __thiscall
pbrt::GoniometricLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,GoniometricLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [64];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [56];
  undefined1 auVar20 [16];
  Vector3f wl;
  SampledSpectrum SVar21;
  undefined1 auVar11 [56];
  undefined1 auVar18 [64];
  
  auVar7 = ZEXT816(0) << 0x40;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[0][1] * 0.0)),
                           auVar7,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]));
  auVar8 = vfmadd231ss_fma(auVar8,auVar7,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  fVar3 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[1][1] * 0.0)),
                           auVar7,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]));
  auVar8 = vfmadd231ss_fma(auVar8,auVar7,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  fVar4 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar7,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  auVar8 = vfmadd231ss_fma(auVar8,auVar7,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0)),
                           auVar7,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]));
  auVar5 = vfmadd231ss_fma(auVar5,auVar7,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar9 = auVar5._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  bVar2 = fVar9 == 1.0;
  fVar6 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  auVar7 = ZEXT416((uint)bVar2 * (int)fVar3 + (uint)!bVar2 * (int)(fVar3 / fVar9));
  fVar6 = (float)((uint)bVar2 * (int)fVar6 + (uint)!bVar2 * (int)(fVar6 / fVar9));
  auVar5 = vinsertps_avx(auVar7,ZEXT416((uint)bVar2 * (int)fVar4 +
                                        (uint)!bVar2 * (int)(fVar4 / fVar9)),0x10);
  auVar8 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                         ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar13._0_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
       auVar8._0_4_;
  auVar13._4_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar8._4_4_;
  auVar13._8_4_ = auVar8._8_4_ + 0.0;
  auVar13._12_4_ = auVar8._12_4_ + 0.0;
  auVar8._8_4_ = 0xbf000000;
  auVar8._0_8_ = 0xbf000000bf000000;
  auVar8._12_4_ = 0xbf000000;
  auVar8 = vmulps_avx512vl(auVar13,auVar8);
  auVar20._0_4_ = auVar5._0_4_ + auVar8._0_4_;
  auVar20._4_4_ = auVar5._4_4_ + auVar8._4_4_;
  auVar20._8_4_ = auVar5._8_4_ + auVar8._8_4_;
  auVar20._12_4_ = auVar5._12_4_ + auVar8._12_4_;
  auVar14._0_4_ = auVar20._0_4_ * auVar20._0_4_;
  auVar14._4_4_ = auVar20._4_4_ * auVar20._4_4_;
  auVar14._8_4_ = auVar20._8_4_ * auVar20._8_4_;
  auVar14._12_4_ = auVar20._12_4_ * auVar20._12_4_;
  auVar8 = vhaddps_avx(auVar14,auVar14);
  fVar3 = fVar6 + (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                   low + ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * -0.5;
  fVar4 = auVar8._0_4_ + fVar3 * fVar3;
  if (fVar4 < 0.0) {
    fVar9 = sqrtf(fVar4);
  }
  else {
    auVar8 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    fVar9 = auVar8._0_4_;
  }
  auVar15._4_4_ = fVar9;
  auVar15._0_4_ = fVar9;
  auVar15._8_4_ = fVar9;
  auVar15._12_4_ = fVar9;
  auVar8 = vdivps_avx(auVar20,auVar15);
  auVar20 = ZEXT416((uint)(fVar3 / fVar9));
  auVar13 = vmovshdup_avx(auVar8);
  fVar12 = auVar13._0_4_;
  auVar13 = vfnmsub231ss_fma(ZEXT416((uint)(fVar12 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [0][1])),auVar8,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar13 = vfnmadd231ss_fma(auVar13,auVar20,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar14 = vfnmsub231ss_fma(ZEXT416((uint)(fVar12 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [1][1])),auVar8,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar14 = vfnmadd231ss_fma(auVar14,auVar20,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar13 = vinsertps_avx(auVar13,auVar14,0x10);
  auVar14 = vfnmsub231ss_fma(ZEXT416((uint)(fVar12 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [2][1])),auVar8,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar14 = vfnmadd231ss_fma(auVar14,auVar20,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar13._0_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>.z = auVar14._0_4_;
  auVar19 = ZEXT856(auVar14._8_8_);
  auVar11 = ZEXT856(auVar13._8_8_);
  SVar21 = I(this,wl,&lambda);
  auVar18._0_8_ = SVar21.values.values._8_8_;
  auVar18._8_56_ = auVar19;
  auVar10._0_8_ = SVar21.values.values._0_8_;
  auVar10._8_56_ = auVar11;
  auVar13 = vmovlhps_avx(auVar10._0_16_,auVar18._0_16_);
  auVar16._4_4_ = fVar4;
  auVar16._0_4_ = fVar4;
  auVar16._8_4_ = fVar4;
  auVar16._12_4_ = fVar4;
  auVar13 = vdivps_avx(auVar13,auVar16);
  auVar17._4_4_ = fVar6;
  auVar17._0_4_ = fVar6;
  auVar17._8_4_ = fVar6;
  auVar17._12_4_ = fVar6;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  __return_storage_ptr__->set = true;
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar13;
  uVar1 = vmovlps_avx(auVar8);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar3 / fVar9;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  auVar8 = vshufps_avx(auVar7,auVar5,0x50);
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar8;
  uVar1 = vmovlps_avx(auVar17);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> GoniometricLight::SampleLi(LightSampleContext ctx,
                                                         Point2f u,
                                                         SampledWavelengths lambda,
                                                         LightSamplingMode mode) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f wi = Normalize(p - ctx.p());
    SampledSpectrum L =
        I(renderFromLight.ApplyInverse(-wi), lambda) / DistanceSquared(p, ctx.p());
    return LightLiSample(L, wi, 1, Interaction(p, &mediumInterface));
}